

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hb_tree.c
# Opt level: O3

_Bool rotate_l(hb_tree *tree,hb_node *q)

{
  ulong uVar1;
  hb_node *phVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  hb_node *phVar7;
  
  if (((q->field_2).bal & 1U) != 0) {
    phVar7 = q->rlink;
    uVar5 = (q->field_2).bal & 0xfffffffffffffffc;
    uVar1 = (phVar7->field_2).bal;
    phVar2 = phVar7->llink;
    (q->field_2).bal = (ulong)((uVar1 & 3) == 0) | (ulong)phVar7;
    q->rlink = phVar2;
    if (phVar2 != (hb_node *)0x0) {
      (phVar2->field_2).bal = (ulong)((uint)(phVar2->field_2).bal & 3) | (ulong)q;
    }
    (phVar7->field_2).pptr = (hb_node *)(uVar5 + (ulong)((uVar1 & 3) == 0) * 2);
    phVar7->llink = q;
    if (uVar5 != 0) {
      tree = (hb_tree *)(uVar5 + 0x20);
      if (*(hb_node **)(uVar5 + 0x18) == q) {
        tree = (hb_tree *)(uVar5 + 0x18);
      }
    }
    tree->root = phVar7;
    return (uVar1 & 3) == 0;
  }
  rotate_l_cold_1();
  for (phVar7 = tree->root; phVar7 != (hb_node *)0x0;
      phVar7 = *(hb_node **)((long)&phVar7->key + lVar6)) {
    iVar4 = (*tree->cmp_func)(q,phVar7->key);
    if (iVar4 < 0) {
      lVar6 = 0x18;
    }
    else {
      lVar6 = 0x20;
      if (iVar4 == 0) goto LAB_00105ab0;
    }
  }
  phVar7 = (hb_node *)0x0;
LAB_00105ab0:
  cVar3 = (char)phVar7 + '\b';
  if (phVar7 == (hb_node *)0x0) {
    cVar3 = '\0';
  }
  return (_Bool)cVar3;
}

Assistant:

static bool
rotate_l(hb_tree* restrict const tree, hb_node* restrict const q)
{
    hb_node* restrict const qp = PARENT(q);
    hb_node* restrict const qr = q->rlink;

    ASSERT(BAL_POS(q));

    hb_node *restrict const qrl = qr->llink;
    const int qr_bal = qr->bal & BAL_MASK;

    /* q->parent <- qr; q->bal <- (qr_bal == 0); */
    q->bal = (intptr_t)qr | (qr_bal == 0);
    if ((q->rlink = qrl) != NULL)
	qrl->bal = (intptr_t)q | (qrl->bal & BAL_MASK); /* qrl->parent <- q; */

    /* qr->parent <- qp; qr->bal <- -(qr_bal == 0); */
    qr->bal = (intptr_t)qp | ((qr_bal == 0) << 1);
    qr->llink = q;
    *(qp == NULL ? &tree->root : qp->llink == q ? &qp->llink : &qp->rlink) = qr;

    return (qr_bal == 0);
}